

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O2

int Gia_ManBmcCheckOutputs(Gia_Man_t *pFrames,int iStart,int iStop)

{
  Gia_Obj_t *pGVar1;
  
  do {
    if (iStop <= iStart) {
      return 1;
    }
    pGVar1 = Gia_ManPo(pFrames,iStart);
    iStart = iStart + 1;
  } while (pFrames->pObjs ==
           (Gia_Obj_t *)
           ((ulong)((uint)*(undefined8 *)pGVar1 >> 0x1d & 1) ^
           (ulong)(pGVar1 + -(ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff))));
  return 0;
}

Assistant:

int Gia_ManBmcCheckOutputs( Gia_Man_t * pFrames, int iStart, int iStop )
{
    int i;
    for ( i = iStart; i < iStop; i++ )
        if ( Gia_ObjChild0(Gia_ManPo(pFrames, i)) != Gia_ManConst0(pFrames) )
            return 0;
    return 1;
}